

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O1

QAccessibleInterface * __thiscall
QAccessibleDockWidget::child(QAccessibleDockWidget *this,int index)

{
  QDockWidget *pQVar1;
  QWidget *pQVar2;
  QWidget *this_00;
  long *plVar3;
  QObject *pQVar4;
  QAccessibleInterface *pQVar5;
  
  pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  pQVar2 = QDockWidget::titleBarWidget(pQVar1);
  this_00 = (QWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  if (pQVar2 != (QWidget *)0x0) {
    pQVar2 = QDockWidget::widget((QDockWidget *)this_00);
    if ((index == 1) || (index == 0 && pQVar2 == (QWidget *)0x0)) {
      pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = QDockWidget::titleBarWidget(pQVar1);
    }
    else {
      if (index != 0) {
        return (QAccessibleInterface *)0x0;
      }
      pQVar1 = (QDockWidget *)(**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar2 = QDockWidget::widget(pQVar1);
    }
    pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(&pQVar2->super_QObject);
    return pQVar5;
  }
  QWidget::layout(this_00);
  plVar3 = (long *)QMetaObject::cast((QObject *)&QDockWidgetLayout::staticMetaObject);
  plVar3 = (long *)(**(code **)(*plVar3 + 0xa8))(plVar3,index);
  if (plVar3 == (long *)0x0) {
    return (QAccessibleInterface *)0x0;
  }
  pQVar4 = (QObject *)(**(code **)(*plVar3 + 0x68))(plVar3);
  pQVar5 = (QAccessibleInterface *)QAccessible::queryAccessibleInterface(pQVar4);
  return pQVar5;
}

Assistant:

QAccessibleInterface *QAccessibleDockWidget::child(int index) const
{
    if (dockWidget()->titleBarWidget()) {
        if ((!dockWidget()->widget() && index == 0) || (index == 1))
            return QAccessible::queryAccessibleInterface(dockWidget()->titleBarWidget());
        if (index == 0)
            return QAccessible::queryAccessibleInterface(dockWidget()->widget());
    } else {
        QLayoutItem *item = dockWidgetLayout()->itemAt(index);
        if (item)
            return QAccessible::queryAccessibleInterface(item->widget());
    }
    return nullptr;
}